

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_WriteBinaryFunc_Test::~ExprWriterTest_WriteBinaryFunc_Test
          (ExprWriterTest_WriteBinaryFunc_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteBinaryFunc) {
  auto x1 = MakeVariable(0);
  auto n42 = MakeConst(42);
  CHECK_WRITE("atan2(x1, 42)", MakeBinary(ex::ATAN2, x1, n42));
  CHECK_WRITE("precision(x1, 42)", MakeBinary(ex::PRECISION, x1, n42));
  CHECK_WRITE("round(x1, 42)", MakeBinary(ex::ROUND, x1, n42));
  CHECK_WRITE("trunc(x1, 42)", MakeBinary(ex::TRUNC, x1, n42));
}